

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

dicthashelement_t * dictinstall(char *name,dicthashelement_t **hashtable)

{
  uint uVar1;
  char *pcVar2;
  dicthashelement_t *pdStack_28;
  uint hashval;
  dicthashelement_t *np;
  dicthashelement_t **hashtable_local;
  char *name_local;
  
  pdStack_28 = dictlookup(name,hashtable);
  if (pdStack_28 == (dicthashelement_t *)0x0) {
    pdStack_28 = (dicthashelement_t *)calloc(1,0x20);
    if (pdStack_28 != (dicthashelement_t *)0x0) {
      pcVar2 = strdup(name);
      pdStack_28->word = pcVar2;
      if (pcVar2 != (char *)0x0) {
        pdStack_28->nphns = 0;
        uVar1 = dicthash(name);
        pdStack_28->next = hashtable[uVar1];
        hashtable[uVar1] = pdStack_28;
        goto LAB_0010296a;
      }
    }
    name_local = (char *)0x0;
  }
  else {
LAB_0010296a:
    name_local = (char *)pdStack_28;
  }
  return (dicthashelement_t *)name_local;
}

Assistant:

dicthashelement_t *dictinstall(char *name, dicthashelement_t **hashtable)
{
    dicthashelement_t  *np;
    unsigned hashval;

    if ((np = dictlookup(name, hashtable)) == NULL)
    {
        np = (dicthashelement_t *) calloc (1,sizeof(*np));
        if (np == NULL || (np->word = strdup(name)) == NULL)
            return NULL;

        np->nphns = 0;
        hashval = dicthash(name);
        np->next = hashtable[hashval];
        hashtable[hashval] = np;
    }
    return np;
}